

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_PlaneEquation::Create(ON_PlaneEquation *this,ON_3dPoint P,ON_3dVector N)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  double dVar6;
  double dVar7;
  
  bVar3 = ON_3dPoint::IsValid(&P);
  if ((bVar3) && (bVar3 = ON_3dVector::IsValid(&N), dVar7 = N.z, dVar2 = N.y, dVar6 = N.x, bVar3)) {
    this->x = N.x;
    this->y = N.y;
    this->z = N.z;
    dVar1 = ON_3dVector::Length((ON_3dVector *)this);
    if (ABS(1.0 - dVar1) <= 2.3283064365386963e-10) {
      uVar4 = SUB84(dVar2,0);
      uVar5 = (undefined4)((ulong)dVar2 >> 0x20);
      bVar3 = true;
    }
    else {
      bVar3 = ON_3dVector::Unitize((ON_3dVector *)this);
      dVar6 = this->x;
      uVar4 = SUB84(this->y,0);
      uVar5 = (undefined4)((ulong)this->y >> 0x20);
      dVar7 = this->z;
    }
    this->d = -(dVar7 * P.z + dVar6 * P.x + (double)CONCAT44(uVar5,uVar4) * P.y);
    return bVar3;
  }
  return false;
}

Assistant:

bool ON_PlaneEquation::Create( ON_3dPoint P, ON_3dVector N )
{
  bool rc = false;
  if ( P.IsValid() && N.IsValid() )
  {
    x = N.x;
    y = N.y;
    z = N.z;
    ON_3dVector* v = (ON_3dVector*)&x;
    rc = (fabs(1.0 - v->Length()) > ON_ZERO_TOLERANCE) ? v->Unitize() : true;
    d = -(x*P.x + y*P.y + z*P.z);
  }
  return rc;
}